

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O2

void __thiscall CEffects::Explosion(CEffects *this,vec2 Pos)

{
  vec2 vVar1;
  vec2 Vel;
  int y;
  int iVar2;
  int x;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  float fVar5;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar6;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 extraout_XMM0_Db;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar7;
  float fVar8;
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  float fVar14;
  vector4_base<float> a;
  vector4_base<float> b;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_128;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_124;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_118;
  CParticle local_d8;
  CParticle local_88;
  long local_38;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  aVar6 = Pos.field_1;
  for (iVar2 = -8; iVar2 != 9; iVar2 = iVar2 + 1) {
    fVar5 = (float)iVar2;
    aVar7 = aVar6;
    for (iVar3 = -8; iVar3 != 9; iVar3 = iVar3 + 1) {
      if (iVar3 != 0 || iVar2 != 0) {
        auVar9._4_12_ = in_XMM2._4_12_;
        auVar9._0_4_ = (float)iVar3;
        fVar14 = SQRT(auVar9._0_4_ * auVar9._0_4_ + fVar5 * fVar5);
        fVar8 = fVar14 / -11.313708 + 1.0;
        local_118 = Pos.field_0;
        auVar11._12_4_ = in_XMM2._12_4_;
        auVar11._0_8_ = auVar9._0_8_;
        auVar11._8_4_ = in_XMM2._4_4_;
        auVar10._8_8_ = auVar11._8_8_;
        auVar10._4_4_ = fVar5;
        auVar10._0_4_ = auVar9._0_4_;
        auVar12._0_12_ = auVar10._0_12_;
        auVar12._12_4_ = aVar6;
        auVar13._4_4_ = fVar14;
        auVar13._0_4_ = fVar14;
        auVar13._8_4_ = fVar14;
        auVar13._12_4_ = fVar14;
        auVar13 = divps(auVar12,auVar13);
        in_XMM2._0_12_ = ZEXT812(0x41200000);
        in_XMM2._12_4_ = 0;
        vVar1.field_1.y = fVar5 * 16.0 + Pos.field_1.y;
        vVar1.field_0.x = auVar9._0_4_ * 16.0 + local_118.x;
        Vel.field_1.y = fVar8 * auVar13._4_4_ * 5000.0;
        Vel.field_0.x = fVar8 * auVar13._0_4_ * 5000.0;
        CFlow::Add(((this->super_CComponent).m_pClient)->m_pFlow,vVar1,Vel,10.0);
        aVar7 = extraout_XMM0_Db;
      }
    }
    aVar6 = aVar7;
  }
  local_88.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  local_88.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  local_88.m_Rotspeed = 0.0;
  local_88.m_Gravity = 0.0;
  local_88.m_Friction = 0.0;
  local_88.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_88.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_88.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_88.m_Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
  local_88.m_Spr = 7;
  local_88.m_FlowAffected = 1.0;
  local_88.m_LifeSpan = 0.4;
  local_88.m_StartSize = 150.0;
  local_88.m_EndSize = 0.0;
  local_88.m_Pos = Pos;
  fVar5 = random_float();
  local_88.m_Rot = fVar5 * 3.1415927 + fVar5 * 3.1415927;
  CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,1,&local_88);
  iVar2 = 0x18;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    local_d8.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    local_d8.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    local_d8.m_LifeSpan = 0.0;
    local_d8.m_StartSize = 32.0;
    local_d8.m_EndSize = 32.0;
    local_d8.m_Rot = 0.0;
    local_d8.m_Rotspeed = 0.0;
    local_d8.m_Gravity = 0.0;
    local_d8.m_Friction = 0.0;
    local_d8.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
    local_d8.m_Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    local_d8.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    local_d8.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
    local_d8.m_Spr = 5;
    local_d8.m_FlowAffected = 1.0;
    local_d8.m_Pos = Pos;
    vVar1 = RandomDir();
    fVar5 = random_float();
    fVar5 = (fVar5 * 0.2 + 1.0) * 1000.0;
    local_128 = vVar1.field_0;
    aStack_124 = vVar1.field_1;
    local_d8.m_Vel.field_1.y = fVar5 * aStack_124.y;
    local_d8.m_Vel.field_0.x = fVar5 * local_128.x;
    fVar5 = random_float();
    local_d8.m_LifeSpan = fVar5 * 0.4 + 0.5;
    fVar5 = random_float();
    local_d8.m_StartSize = fVar5 * 8.0 + 32.0;
    local_d8.m_EndSize = 0.0;
    fVar5 = random_float();
    local_d8.m_Friction = 0.4;
    local_d8.m_Gravity = fVar5 * -800.0;
    fVar5 = random_float();
    a.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f400000;
    a.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    a.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f400000;
    a.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f400000;
    b.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f000000;
    b.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    b.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f000000;
    b.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f000000;
    local_d8.m_Color = mix<vector4_base<float>,float>(a,b,fVar5);
    CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,2,&local_d8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::Explosion(vec2 Pos)
{
	// add to flow
	for(int y = -8; y <= 8; y++)
		for(int x = -8; x <= 8; x++)
		{
			if(x == 0 && y == 0)
				continue;

			float a = 1 - (length(vec2(x,y)) / length(vec2(8,8)));
			m_pClient->m_pFlow->Add(Pos+vec2(x,y)*16, normalize(vec2(x,y))*5000.0f*a, 10.0f);
		}

	// add the explosion
	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_EXPL01;
	p.m_Pos = Pos;
	p.m_LifeSpan = 0.4f;
	p.m_StartSize = 150.0f;
	p.m_EndSize = 0;
	p.m_Rot = random_float()*pi*2;
	m_pClient->m_pParticles->Add(CParticles::GROUP_EXPLOSIONS, &p);

	// add the smoke
	for(int i = 0; i < 24; i++)
	{
		CParticle p;
		p.SetDefault();
		p.m_Spr = SPRITE_PART_SMOKE;
		p.m_Pos = Pos;
		p.m_Vel = RandomDir() * ((1.0f + random_float()*0.2f) * 1000.0f);
		p.m_LifeSpan = 0.5f + random_float()*0.4f;
		p.m_StartSize = 32.0f + random_float()*8;
		p.m_EndSize = 0;
		p.m_Gravity = random_float()*-800.0f;
		p.m_Friction = 0.4f;
		p.m_Color = mix(vec4(0.75f,0.75f,0.75f,1.0f), vec4(0.5f,0.5f,0.5f,1.0f), random_float());
		m_pClient->m_pParticles->Add(CParticles::GROUP_GENERAL, &p);
	}
}